

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O1

bool embree::avx::intersect_triangle_triangle
               (Scene *scene0,uint geomID0,uint primID0,Scene *scene1,uint geomID1,uint primID1)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  bool bVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vec3fa b2;
  Vec3fa b1;
  Vec3fa b0;
  Vec3fa a2;
  Vec3fa a1;
  Vec3fa a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  if ((geomID0 != geomID1 || scene0 != scene1) || primID0 != primID1) {
    pGVar3 = (scene0->geometries).items[geomID0].ptr;
    pGVar4 = (scene1->geometries).items[geomID1].ptr;
    lVar5 = *(long *)&pGVar3->field_0x58;
    lVar12 = (ulong)primID0 *
             pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar6 = *(long *)&pGVar4->field_0x58;
    lVar11 = (ulong)primID1 *
             pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    if (geomID0 != geomID1 || scene0 != scene1) {
LAB_0132adc5:
      lVar7 = *(long *)&pGVar3[1].time_range.upper;
      p_Var8 = pGVar3[1].intersectionFilterN;
      puVar1 = (undefined8 *)(lVar7 + (ulong)*(uint *)(lVar5 + lVar12) * (long)p_Var8);
      local_18._0_8_ = *puVar1;
      local_18._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar7 + (ulong)*(uint *)(lVar5 + 4 + lVar12) * (long)p_Var8);
      local_28._0_8_ = *puVar1;
      local_28._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar7 + (ulong)*(uint *)(lVar5 + 8 + lVar12) * (long)p_Var8);
      local_38._0_8_ = *puVar1;
      local_38._8_8_ = puVar1[1];
      lVar5 = *(long *)&pGVar4[1].time_range.upper;
      p_Var8 = pGVar4[1].intersectionFilterN;
      puVar1 = (undefined8 *)(lVar5 + (ulong)*(uint *)(lVar6 + lVar11) * (long)p_Var8);
      local_48._0_8_ = *puVar1;
      local_48._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar5 + (ulong)*(uint *)(lVar6 + 4 + lVar11) * (long)p_Var8);
      local_58._0_8_ = *puVar1;
      local_58._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar5 + (ulong)*(uint *)(lVar6 + 8 + lVar11) * (long)p_Var8);
      local_68._0_8_ = *puVar1;
      local_68._8_8_ = puVar1[1];
      bVar10 = TriangleTriangleIntersector::intersect_triangle_triangle
                         ((Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,
                          (Vec3fa *)&local_38.field_1,(Vec3fa *)&local_48.field_1,
                          (Vec3fa *)&local_58.field_1,(Vec3fa *)&local_68.field_1);
      return bVar10;
    }
    uVar2 = *(undefined4 *)(lVar5 + 8 + lVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(lVar5 + lVar12);
    auVar13 = vpinsrd_avx(auVar13,uVar2,2);
    auVar9 = vpinsrd_avx(auVar13,uVar2,3);
    uVar2 = *(undefined4 *)(lVar6 + lVar11);
    auVar14._4_4_ = uVar2;
    auVar14._0_4_ = uVar2;
    auVar14._8_4_ = uVar2;
    auVar14._12_4_ = uVar2;
    auVar13 = vpcmpeqd_avx(auVar14,auVar9);
    if ((((auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf]) {
      uVar2 = *(undefined4 *)(lVar6 + 4 + lVar11);
      auVar15._4_4_ = uVar2;
      auVar15._0_4_ = uVar2;
      auVar15._8_4_ = uVar2;
      auVar15._12_4_ = uVar2;
      auVar13 = vpcmpeqd_avx(auVar15,auVar9);
      if ((((auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf])
      {
        uVar2 = *(undefined4 *)(lVar6 + 8 + lVar11);
        auVar16._4_4_ = uVar2;
        auVar16._0_4_ = uVar2;
        auVar16._8_4_ = uVar2;
        auVar16._12_4_ = uVar2;
        auVar13 = vpcmpeqd_avx(auVar16,auVar9);
        if ((((auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf]
           ) goto LAB_0132adc5;
      }
    }
  }
  return false;
}

Assistant:

bool intersect_triangle_triangle (Scene* scene0, unsigned geomID0, unsigned primID0, Scene* scene1, unsigned geomID1, unsigned primID1)
    {
      CSTAT(bvh_collide_prim_intersections1++);
      const TriangleMesh* mesh0 = scene0->get<TriangleMesh>(geomID0);
      const TriangleMesh* mesh1 = scene1->get<TriangleMesh>(geomID1);
      const TriangleMesh::Triangle& tri0 = mesh0->triangle(primID0);
      const TriangleMesh::Triangle& tri1 = mesh1->triangle(primID1);
      
      /* special culling for scene intersection with itself */
      if (scene0 == scene1 && geomID0 == geomID1)
      {
        /* ignore self intersections */
        if (primID0 == primID1)
          return false;
      }
      CSTAT(bvh_collide_prim_intersections2++);
      
      if (scene0 == scene1 && geomID0 == geomID1)
      {
        /* ignore intersection with topological neighbors */
        const vint4 t0(tri0.v[0],tri0.v[1],tri0.v[2],tri0.v[2]);
        if (any(vint4(tri1.v[0]) == t0)) return false;
        if (any(vint4(tri1.v[1]) == t0)) return false;
        if (any(vint4(tri1.v[2]) == t0)) return false;
      }
      CSTAT(bvh_collide_prim_intersections3++);
      
      const Vec3fa a0 = mesh0->vertex(tri0.v[0]);
      const Vec3fa a1 = mesh0->vertex(tri0.v[1]);
      const Vec3fa a2 = mesh0->vertex(tri0.v[2]);
      const Vec3fa b0 = mesh1->vertex(tri1.v[0]);
      const Vec3fa b1 = mesh1->vertex(tri1.v[1]);
      const Vec3fa b2 = mesh1->vertex(tri1.v[2]);
      
      return TriangleTriangleIntersector::intersect_triangle_triangle(a0,a1,a2,b0,b1,b2);
    }